

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandAbc9Cone(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Vec_Vec_t *p;
  bool bVar1;
  int iVar2;
  Gia_Man_t *pGVar3;
  Vec_Int_t *pVVar4;
  int *piVar5;
  char *pcVar6;
  Vec_Vec_t *vClasses;
  Vec_Int_t *vClass;
  int fVerbose;
  int fUseAllCis;
  int nTimeWindow;
  int nLevelMax;
  int iPartNum;
  int nOutRange;
  int iOutNum;
  int c;
  Vec_Int_t *vPos;
  Gia_Man_t *pTemp;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  iPartNum = -1;
  nLevelMax = 1;
  nTimeWindow = -1;
  fUseAllCis = 0;
  fVerbose = 0;
  bVar1 = false;
  vClass._0_4_ = 0;
  Extra_UtilGetoptReset();
LAB_0025f75e:
  do {
    iVar2 = Extra_UtilGetopt(argc,argv,"ORPLWavh");
    if (iVar2 == -1) {
      if (pAbc->pGia == (Gia_Man_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Cone(): There is no AIG.\n");
        return 1;
      }
      if ((fUseAllCis != 0) || (fVerbose != 0)) {
        if ((fUseAllCis != 0) && (fVerbose != 0)) {
          Abc_Print(-1,
                    "Abc_CommandAbc9Cone(): Parameters -L (max level) and -W (timing window) cannot be specified at the same time.\n"
                   );
          return 1;
        }
        pGVar3 = Gia_ManExtractWindow(pAbc->pGia,fUseAllCis,fVerbose,(uint)vClass);
        Abc_FrameUpdateGia(pAbc,pGVar3);
        return 0;
      }
      if (nTimeWindow < 0) {
        if ((-1 < iPartNum) && (iVar2 = Gia_ManPoNum(pAbc->pGia), iPartNum + nLevelMax <= iVar2)) {
          pVVar4 = Vec_IntStartRange(iPartNum,nLevelMax);
          pGVar3 = pAbc->pGia;
          piVar5 = Vec_IntArray(pVVar4);
          pGVar3 = Gia_ManDupCones(pGVar3,piVar5,nLevelMax,(uint)((bVar1 ^ 0xffU) & 1));
          Vec_IntFree(pVVar4);
          if (pGVar3 != (Gia_Man_t *)0x0) {
            Abc_FrameUpdateGia(pAbc,pGVar3);
          }
          return 0;
        }
        Abc_Print(-1,"Abc_CommandAbc9Cone(): Range of outputs to extract is incorrect.\n");
        return 1;
      }
      p = (Vec_Vec_t *)pAbc->vPoEquivs;
      if (p == (Vec_Vec_t *)0x0) {
        Abc_Print(-1,"Abc_CommandAbc9Cone(): Partitions are not defined.\n");
        return 1;
      }
      iVar2 = Vec_VecSize(p);
      if (iVar2 <= nTimeWindow) {
        Abc_Print(-1,"Abc_CommandAbc9Cone(): Partition index exceed the array size.\n");
        return 1;
      }
      pVVar4 = Vec_VecEntryInt(p,nTimeWindow);
      pGVar3 = pAbc->pGia;
      piVar5 = Vec_IntArray(pVVar4);
      iVar2 = Vec_IntSize(pVVar4);
      pGVar3 = Gia_ManDupCones(pGVar3,piVar5,iVar2,(uint)((bVar1 ^ 0xffU) & 1));
      if (pGVar3 != (Gia_Man_t *)0x0) {
        Abc_FrameUpdateGia(pAbc,pGVar3);
      }
      return 0;
    }
    switch(iVar2) {
    case 0x4c:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-L\" should be followed by an integer.\n");
        goto LAB_0025fc0b;
      }
      fUseAllCis = atoi(argv[globalUtilOptind]);
      iVar2 = fUseAllCis;
      break;
    default:
      goto LAB_0025fc0b;
    case 0x4f:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-O\" should be followed by an integer.\n");
        goto LAB_0025fc0b;
      }
      iPartNum = atoi(argv[globalUtilOptind]);
      iVar2 = iPartNum;
      break;
    case 0x50:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-P\" should be followed by an integer.\n");
        goto LAB_0025fc0b;
      }
      nTimeWindow = atoi(argv[globalUtilOptind]);
      iVar2 = nTimeWindow;
      break;
    case 0x52:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-R\" should be followed by an integer.\n");
        goto LAB_0025fc0b;
      }
      nLevelMax = atoi(argv[globalUtilOptind]);
      iVar2 = nLevelMax;
      break;
    case 0x57:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-W\" should be followed by an integer.\n");
        goto LAB_0025fc0b;
      }
      fVerbose = atoi(argv[globalUtilOptind]);
      iVar2 = fVerbose;
      break;
    case 0x61:
      bVar1 = (bool)(bVar1 ^ 1);
      goto LAB_0025f75e;
    case 0x68:
      goto LAB_0025fc0b;
    case 0x76:
      vClass._0_4_ = (uint)vClass ^ 1;
      goto LAB_0025f75e;
    }
    globalUtilOptind = globalUtilOptind + 1;
    if (iVar2 < 0) {
LAB_0025fc0b:
      Abc_Print(-2,"usage: &cone [-ORPLW num] [-avh]\n");
      Abc_Print(-2,"\t         extracting multi-output sequential logic cones\n");
      Abc_Print(-2,"\t-O num : the index of first PO to extract [default = %d]\n",
                (ulong)(uint)iPartNum);
      Abc_Print(-2,"\t-R num : (optional) the number of outputs to extract [default = %d]\n",
                (ulong)(uint)nLevelMax);
      Abc_Print(-2,"\t-P num : (optional) the partition number to extract [default = %d]\n",
                (ulong)(uint)nTimeWindow);
      Abc_Print(-2,"\t-L num : (optional) extract cones with higher level [default = %d]\n",
                (ulong)(uint)fUseAllCis);
      Abc_Print(-2,"\t-W num : (optional) extract cones falling into this window [default = %d]\n",
                (ulong)(uint)fVerbose);
      pcVar6 = "structural";
      if (bVar1) {
        pcVar6 = "all";
      }
      Abc_Print(-2,"\t-a     : toggle keeping all CIs or structral support only [default = %s]\n",
                pcVar6);
      pcVar6 = "no";
      if ((uint)vClass != 0) {
        pcVar6 = "yes";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar6);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      return 1;
    }
  } while( true );
}

Assistant:

int Abc_CommandAbc9Cone( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Gia_Man_t * pTemp;
    Vec_Int_t * vPos;
    int c, iOutNum = -1, nOutRange = 1, iPartNum = -1, nLevelMax = 0, nTimeWindow = 0, fUseAllCis = 0, fVerbose = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "ORPLWavh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            iOutNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iOutNum < 0 )
                goto usage;
            break;
        case 'R':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-R\" should be followed by an integer.\n" );
                goto usage;
            }
            nOutRange = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nOutRange < 0 )
                goto usage;
            break;
        case 'P':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-P\" should be followed by an integer.\n" );
                goto usage;
            }
            iPartNum = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( iPartNum < 0 )
                goto usage;
            break;
        case 'L':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-L\" should be followed by an integer.\n" );
                goto usage;
            }
            nLevelMax = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nLevelMax < 0 )
                goto usage;
            break;
        case 'W':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-W\" should be followed by an integer.\n" );
                goto usage;
            }
            nTimeWindow = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nTimeWindow < 0 )
                goto usage;
            break;
        case 'a':
            fUseAllCis ^= 1;
            break;
        case 'v':
            fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9Cone(): There is no AIG.\n" );
        return 1;
    }
    if ( nLevelMax || nTimeWindow )
    {
        if ( nLevelMax && nTimeWindow )
        {
            Abc_Print( -1, "Abc_CommandAbc9Cone(): Parameters -L (max level) and -W (timing window) cannot be specified at the same time.\n" );
            return 1;
        }
        else
        {
            pTemp = Gia_ManExtractWindow( pAbc->pGia, nLevelMax, nTimeWindow, fVerbose );
            Abc_FrameUpdateGia( pAbc, pTemp );
            return 0;
        }
    }
    if ( iPartNum >= 0 )
    {
        Vec_Int_t * vClass;
        Vec_Vec_t * vClasses = (Vec_Vec_t *)pAbc->vPoEquivs;
        if ( vClasses == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9Cone(): Partitions are not defined.\n" );
            return 1;
        }
        if ( iPartNum >= Vec_VecSize(vClasses) )
        {
            Abc_Print( -1, "Abc_CommandAbc9Cone(): Partition index exceed the array size.\n" );
            return 1;
        }
        vClass = Vec_VecEntryInt( vClasses, iPartNum );
        pTemp = Gia_ManDupCones( pAbc->pGia, Vec_IntArray(vClass), Vec_IntSize(vClass), !fUseAllCis );
        if ( pTemp )
            Abc_FrameUpdateGia( pAbc, pTemp );
        return 0;
    }
    if ( iOutNum < 0 || iOutNum + nOutRange > Gia_ManPoNum(pAbc->pGia) )
    {
        Abc_Print( -1, "Abc_CommandAbc9Cone(): Range of outputs to extract is incorrect.\n" );
        return 1;
    }
    vPos = Vec_IntStartRange( iOutNum, nOutRange );
    pTemp = Gia_ManDupCones( pAbc->pGia, Vec_IntArray(vPos), nOutRange, !fUseAllCis );
    Vec_IntFree( vPos );
    if ( pTemp )
        Abc_FrameUpdateGia( pAbc, pTemp );
    return 0;

usage:
    Abc_Print( -2, "usage: &cone [-ORPLW num] [-avh]\n" );
    Abc_Print( -2, "\t         extracting multi-output sequential logic cones\n" );
    Abc_Print( -2, "\t-O num : the index of first PO to extract [default = %d]\n", iOutNum );
    Abc_Print( -2, "\t-R num : (optional) the number of outputs to extract [default = %d]\n", nOutRange );
    Abc_Print( -2, "\t-P num : (optional) the partition number to extract [default = %d]\n", iPartNum );
    Abc_Print( -2, "\t-L num : (optional) extract cones with higher level [default = %d]\n", nLevelMax );
    Abc_Print( -2, "\t-W num : (optional) extract cones falling into this window [default = %d]\n", nTimeWindow );
    Abc_Print( -2, "\t-a     : toggle keeping all CIs or structral support only [default = %s]\n", fUseAllCis? "all": "structural" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n", fVerbose? "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    return 1;
}